

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

int cs::tree_type<cs::token_base_*>::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  tree_node *node;
  tree_node *local_8;
  
  if (dst == (EVP_PKEY_CTX *)0x0) {
    local_8 = (tree_node *)0x0;
  }
  else {
    local_8 = (tree_node *)operator_new(0x20);
    tree_type<cs::token_base*>::tree_node::tree_node<cs::token_base*&>
              (local_8,(tree_node *)src,(tree_node *)0x0,(tree_node *)0x0,
               (token_base **)(dst + 0x18));
    iVar1 = copy(*(EVP_PKEY_CTX **)(dst + 8),(EVP_PKEY_CTX *)local_8);
    *(ulong *)(local_8 + 8) = CONCAT44(extraout_var,iVar1);
    iVar1 = copy(*(EVP_PKEY_CTX **)(dst + 0x10),(EVP_PKEY_CTX *)local_8);
    *(ulong *)(local_8 + 0x10) = CONCAT44(extraout_var_00,iVar1);
  }
  return (int)local_8;
}

Assistant:

static tree_node *copy(tree_node *raw, tree_node *root = nullptr)
		{
			if (raw == nullptr) return nullptr;
			tree_node *node = new tree_node(root, nullptr, nullptr, raw->data);
			node->left = copy(raw->left, node);
			node->right = copy(raw->right, node);
			return node;
		}